

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadapi_pthreads.c
# Opt level: O2

THREADAPI_RESULT ThreadAPI_Join(THREAD_HANDLE threadHandle,int *res)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  THREADAPI_RESULT TVar3;
  void *threadResult;
  
  if (threadHandle == (THREAD_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    TVar3 = THREADAPI_INVALID_ARG;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/threadapi_pthreads.c"
                ,"ThreadAPI_Join",0x61,1,"(result = %s%s (%d))","",THREADAPI_RESULTStringStorage[2],
                2);
    }
  }
  else {
    iVar1 = pthread_join(*threadHandle,&threadResult);
    if (iVar1 == 0) {
      TVar3 = THREADAPI_OK;
      if (res != (int *)0x0) {
        *res = (int)threadResult;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      TVar3 = THREADAPI_ERROR;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/threadapi_pthreads.c"
                  ,"ThreadAPI_Join",0x69,1,"(result = %s%s (%d))","",
                  THREADAPI_RESULTStringStorage[4],4);
      }
    }
    free(threadHandle);
  }
  return TVar3;
}

Assistant:

THREADAPI_RESULT ThreadAPI_Join(THREAD_HANDLE threadHandle, int* res)
{
    THREADAPI_RESULT result;

    THREAD_INSTANCE* threadInstance = (THREAD_INSTANCE*)threadHandle;
    if (threadInstance == NULL)
    {
        result = THREADAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
    }
    else
    {
        void* threadResult;
        if (pthread_join(threadInstance->Pthread_handle, &threadResult) != 0)
        {
            result = THREADAPI_ERROR;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
        }
        else
        {
            if (res != NULL)
            {
                *res = (int)(intptr_t)threadResult;
            }

            result = THREADAPI_OK;
        }

        free(threadInstance);
    }

    return result;
}